

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

LClosure * getcached(Proto *p,UpVal **encup,StkId base)

{
  LClosure *pLVar1;
  Upvaldesc *pUVar2;
  TValue *local_58;
  TValue *v;
  int i;
  Upvaldesc *uv;
  int nup;
  LClosure *c;
  StkId base_local;
  UpVal **encup_local;
  Proto *p_local;
  
  pLVar1 = p->cache;
  if (pLVar1 != (LClosure *)0x0) {
    pUVar2 = p->upvalues;
    for (v._4_4_ = 0; v._4_4_ < p->sizeupvalues; v._4_4_ = v._4_4_ + 1) {
      if (pUVar2[v._4_4_].instack == '\0') {
        local_58 = encup[pUVar2[v._4_4_].idx]->v;
      }
      else {
        local_58 = base + (int)(uint)pUVar2[v._4_4_].idx;
      }
      if (pLVar1->upvals[v._4_4_]->v != local_58) {
        return (LClosure *)0x0;
      }
    }
  }
  return pLVar1;
}

Assistant:

static LClosure *getcached (Proto *p, UpVal **encup, StkId base) {
  LClosure *c = p->cache;
  if (c != NULL) {  /* is there a cached closure? */
    int nup = p->sizeupvalues;
    Upvaldesc *uv = p->upvalues;
    int i;
    for (i = 0; i < nup; i++) {  /* check whether it has right upvalues */
      TValue *v = uv[i].instack ? base + uv[i].idx : encup[uv[i].idx]->v;
      if (c->upvals[i]->v != v)
        return NULL;  /* wrong upvalue; cannot reuse closure */
    }
  }
  return c;  /* return cached closure (or NULL if no cached closure) */
}